

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot_items.cpp
# Opt level: O1

bool __thiscall
ImPlot::ShadedRenderer<ImPlot::GetterYs<double>,_ImPlot::GetterYRef,_ImPlot::TransformerLogLin>::
operator()(ShadedRenderer<ImPlot::GetterYs<double>,_ImPlot::GetterYRef,_ImPlot::TransformerLogLin>
           *this,ImDrawList *DrawList,ImRect *param_2,ImVec2 *uv,int prim)

{
  float fVar1;
  float fVar2;
  double dVar3;
  double dVar4;
  int iVar5;
  GetterYs<double> *pGVar6;
  TransformerLogLin *pTVar7;
  ImPlotPlot *pIVar8;
  GetterYRef *pGVar9;
  ImDrawVert *pIVar10;
  uint *puVar11;
  ImVec2 IVar12;
  double dVar13;
  double dVar14;
  ImVec2 IVar15;
  ImPlotContext *pIVar16;
  ImPlotContext *pIVar17;
  uint uVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  
  pIVar16 = GImPlot;
  pGVar6 = this->Getter1;
  pTVar7 = this->Transformer;
  dVar14 = (double)(prim + 1);
  iVar5 = pGVar6->Count;
  dVar3 = *(double *)
           ((long)pGVar6->Ys +
           (long)(((prim + 1 + pGVar6->Offset) % iVar5 + iVar5) % iVar5) * (long)pGVar6->Stride);
  dVar13 = log10((pGVar6->XScale * dVar14 + pGVar6->X0) / (GImPlot->CurrentPlot->XAxis).Range.Min);
  pIVar17 = GImPlot;
  pIVar8 = pIVar16->CurrentPlot;
  dVar4 = (pIVar8->XAxis).Range.Min;
  iVar5 = pTVar7->YAxis;
  fVar20 = (float)((((double)(float)(dVar13 / pIVar16->LogDenX) *
                     ((pIVar8->XAxis).Range.Max - dVar4) + dVar4) - dVar4) * pIVar16->Mx +
                  (double)pIVar16->PixelRange[iVar5].Min.x);
  fVar22 = (float)((dVar3 - pIVar8->YAxis[iVar5].Range.Min) * pIVar16->My[iVar5] +
                  (double)pIVar16->PixelRange[iVar5].Min.y);
  pGVar9 = this->Getter2;
  pTVar7 = this->Transformer;
  dVar3 = pGVar9->YRef;
  dVar13 = log10((dVar14 * pGVar9->XScale + pGVar9->X0) / (GImPlot->CurrentPlot->XAxis).Range.Min);
  pIVar8 = pIVar17->CurrentPlot;
  dVar4 = (pIVar8->XAxis).Range.Min;
  iVar5 = pTVar7->YAxis;
  fVar19 = (float)((((double)(float)(dVar13 / pIVar17->LogDenX) *
                     ((pIVar8->XAxis).Range.Max - dVar4) + dVar4) - dVar4) * pIVar17->Mx +
                  (double)pIVar17->PixelRange[iVar5].Min.x);
  fVar24 = (float)((dVar3 - pIVar8->YAxis[iVar5].Range.Min) * pIVar17->My[iVar5] +
                  (double)pIVar17->PixelRange[iVar5].Min.y);
  fVar21 = (this->P12).x;
  fVar23 = fVar21 - fVar19;
  fVar26 = (this->P11).x;
  fVar1 = (this->P11).y;
  fVar2 = (this->P12).y;
  fVar27 = fVar26 * fVar22 - fVar20 * fVar1;
  fVar21 = fVar21 * fVar24 - fVar19 * fVar2;
  fVar26 = fVar26 - fVar20;
  fVar25 = fVar26 * (fVar2 - fVar24) - fVar23 * (fVar1 - fVar22);
  DrawList->_VtxWritePtr->pos = this->P11;
  DrawList->_VtxWritePtr->uv = *uv;
  pIVar10 = DrawList->_VtxWritePtr;
  pIVar10->col = this->Col;
  pIVar10[1].pos.x = fVar20;
  pIVar10[1].pos.y = fVar22;
  DrawList->_VtxWritePtr[1].uv = *uv;
  pIVar10 = DrawList->_VtxWritePtr;
  pIVar10[1].col = this->Col;
  IVar15.y = ((fVar2 - fVar24) * fVar27 - (fVar1 - fVar22) * fVar21) / fVar25;
  IVar15.x = (fVar27 * fVar23 - fVar26 * fVar21) / fVar25;
  pIVar10[2].pos = IVar15;
  DrawList->_VtxWritePtr[2].uv = *uv;
  pIVar10 = DrawList->_VtxWritePtr;
  pIVar10[2].col = this->Col;
  pIVar10[3].pos = this->P12;
  DrawList->_VtxWritePtr[3].uv = *uv;
  pIVar10 = DrawList->_VtxWritePtr;
  pIVar10[3].col = this->Col;
  IVar12.y = fVar24;
  IVar12.x = fVar19;
  pIVar10[4].pos = IVar12;
  DrawList->_VtxWritePtr[4].uv = *uv;
  pIVar10 = DrawList->_VtxWritePtr;
  pIVar10[4].col = this->Col;
  DrawList->_VtxWritePtr = pIVar10 + 5;
  puVar11 = DrawList->_IdxWritePtr;
  *puVar11 = DrawList->_VtxCurrentIdx;
  uVar18 = -(uint)(fVar2 < fVar1 && fVar22 < fVar24 || fVar1 < fVar2 && fVar24 < fVar22) & 1;
  puVar11[1] = DrawList->_VtxCurrentIdx + uVar18 + 1;
  puVar11[2] = DrawList->_VtxCurrentIdx + 3;
  puVar11[3] = DrawList->_VtxCurrentIdx + 1;
  puVar11[4] = (uVar18 ^ 3) + DrawList->_VtxCurrentIdx;
  puVar11[5] = DrawList->_VtxCurrentIdx + 4;
  DrawList->_IdxWritePtr = puVar11 + 6;
  DrawList->_VtxCurrentIdx = DrawList->_VtxCurrentIdx + 5;
  (this->P11).x = fVar20;
  (this->P11).y = fVar22;
  (this->P12).x = fVar19;
  (this->P12).y = fVar24;
  return true;
}

Assistant:

inline bool operator()(ImDrawList& DrawList, const ImRect& /*cull_rect*/, const ImVec2& uv, int prim) const {
        // TODO: Culling
        ImVec2 P21 = Transformer(Getter1(prim+1));
        ImVec2 P22 = Transformer(Getter2(prim+1));
        const int intersect = (P11.y > P12.y && P22.y > P21.y) || (P12.y > P11.y && P21.y > P22.y);
        ImVec2 intersection = Intersection(P11,P21,P12,P22);
        DrawList._VtxWritePtr[0].pos = P11;
        DrawList._VtxWritePtr[0].uv  = uv;
        DrawList._VtxWritePtr[0].col = Col;
        DrawList._VtxWritePtr[1].pos = P21;
        DrawList._VtxWritePtr[1].uv  = uv;
        DrawList._VtxWritePtr[1].col = Col;
        DrawList._VtxWritePtr[2].pos = intersection;
        DrawList._VtxWritePtr[2].uv  = uv;
        DrawList._VtxWritePtr[2].col = Col;
        DrawList._VtxWritePtr[3].pos = P12;
        DrawList._VtxWritePtr[3].uv  = uv;
        DrawList._VtxWritePtr[3].col = Col;
        DrawList._VtxWritePtr[4].pos = P22;
        DrawList._VtxWritePtr[4].uv  = uv;
        DrawList._VtxWritePtr[4].col = Col;
        DrawList._VtxWritePtr += 5;
        DrawList._IdxWritePtr[0] = (ImDrawIdx)(DrawList._VtxCurrentIdx);
        DrawList._IdxWritePtr[1] = (ImDrawIdx)(DrawList._VtxCurrentIdx + 1 + intersect);
        DrawList._IdxWritePtr[2] = (ImDrawIdx)(DrawList._VtxCurrentIdx + 3);
        DrawList._IdxWritePtr[3] = (ImDrawIdx)(DrawList._VtxCurrentIdx + 1);
        DrawList._IdxWritePtr[4] = (ImDrawIdx)(DrawList._VtxCurrentIdx + 3 - intersect);
        DrawList._IdxWritePtr[5] = (ImDrawIdx)(DrawList._VtxCurrentIdx + 4);
        DrawList._IdxWritePtr += 6;
        DrawList._VtxCurrentIdx += 5;
        P11 = P21;
        P12 = P22;
        return true;
    }